

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O3

void http1_on_data(intptr_t uuid,fio_protocol_s *protocol)

{
  size_t sVar1;
  ssize_t sVar2;
  
  if (*(char *)((long)&protocol[5].on_shutdown + 2) != '\0') {
    fio_suspend(uuid);
    return;
  }
  sVar1 = protocol[4].rsv;
  if (sVar1 != 0x2000) {
    sVar2 = fio_read(uuid,(void *)((long)&protocol[5].on_shutdown + sVar1 + 3),0x2000 - sVar1);
    if (0 < sVar2) {
      protocol[4].rsv = protocol[4].rsv + sVar2;
    }
  }
  http1_consume_data(uuid,(http1pr_s *)protocol);
  return;
}

Assistant:

static void http1_on_data(intptr_t uuid, fio_protocol_s *protocol) {
  http1pr_s *p = (http1pr_s *)protocol;
  if (p->stop) {
    fio_suspend(uuid);
    return;
  }
  ssize_t i = 0;
  if (HTTP_MAX_HEADER_LENGTH - p->buf_len)
    i = fio_read(uuid, p->buf + p->buf_len,
                 HTTP_MAX_HEADER_LENGTH - p->buf_len);
  if (i > 0) {
    p->buf_len += i;
  }
  http1_consume_data(uuid, p);
}